

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.c
# Opt level: O3

int pu(int u,int i,int f)

{
  size_t sVar1;
  char *pcVar2;
  
  if (0 < u) {
    if ((f & 2U) != 0) {
      pcVar2 = ucp + 1;
      *ucp = '-';
      ucp = pcVar2;
    }
    pcVar2 = ucp;
    if (unames[i] == (char *)0x0) {
      sprintf(ucp,"*%c*",(ulong)(i + 0x61));
      pcVar2 = ucp;
    }
    else {
      strcpy(ucp,unames[i]);
    }
    sVar1 = strlen(pcVar2);
    pcVar2 = pcVar2 + sVar1;
    ucp = pcVar2;
    if (u != 1) {
      ucp = pcVar2 + 1;
      *pcVar2 = (char)u + '0';
    }
    return 2;
  }
  return (int)(u != 0);
}

Assistant:

static int pu(int u, int i, int f)
{

	if(u > 0) {
		if(f&2)
			*ucp++ = '-';
		if(unames[i]) {
			sprintf(ucp,"%s", unames[i]);
			ucp += strlen(ucp);
		} else{
			sprintf(ucp,"*%c*", i+'a');
			ucp += strlen(ucp);
		}
		if(u > 1)
			*ucp++ = (u+'0');
			return(2);
	}
	if(u < 0)
		return(1);
	return(0);
}